

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::InputScalarAsWidgetReplacement
               (ImRect *bb,ImGuiID id,char *label,ImGuiDataType data_type,void *data_ptr,
               char *format)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImGuiWindow *window;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  char *fmt;
  ImGuiInputTextFlags flags;
  ImGuiContext *g;
  float fVar6;
  double dVar7;
  char data_buf [32];
  char fmt_buf [32];
  char local_88 [40];
  ImVec2 local_60;
  char local_58 [40];
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  window->WriteAccessed = true;
  SetActiveID(pIVar3->ScalarAsInputTextId,window);
  pIVar3->ActiveIdAllowNavDirFlags = 0xc;
  pIVar4 = GImGui;
  GImGui->HoveredId = 0;
  pIVar4->HoveredIdAllowOverlap = false;
  pIVar4->HoveredIdTimer = 0.0;
  uVar1 = window->FocusIdxAllCounter;
  uVar2 = window->FocusIdxTabCounter;
  window->FocusIdxAllCounter = uVar1 + -1;
  window->FocusIdxTabCounter = uVar2 + -1;
  fmt = ParseFormatTrimDecorations(format,local_58,0x20);
  if (data_type < ImGuiDataType_Float) {
    ImFormatString(local_88,0x20,fmt,(ulong)*data_ptr);
  }
  else {
    if (data_type == ImGuiDataType_Double) {
      dVar7 = *data_ptr;
    }
    else {
      if (data_type != ImGuiDataType_Float) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                      ,0x2104,
                      "int DataTypeFormatString(char *, int, ImGuiDataType, const void *, const char *)"
                     );
      }
      dVar7 = (double)*data_ptr;
    }
    ImFormatString(local_88,0x20,fmt,dVar7);
  }
  flags = 0x11;
  if ((data_type & ~ImGuiDataType_Uint32) == ImGuiDataType_Float) {
    flags = 0x20010;
  }
  local_60.x = (bb->Max).x - (bb->Min).x;
  local_60.y = (bb->Max).y - (bb->Min).y;
  bVar5 = InputTextEx(label,local_88,0x20,&local_60,flags,(ImGuiTextEditCallback)0x0,(void *)0x0);
  if (pIVar3->ScalarAsInputTextId == 0) {
    if (pIVar3->ActiveId != id) {
      __assert_fail("g.ActiveId == id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.cpp"
                    ,0x2199,
                    "bool ImGui::InputScalarAsWidgetReplacement(const ImRect &, ImGuiID, const char *, ImGuiDataType, void *, const char *)"
                   );
    }
    pIVar3->ScalarAsInputTextId = id;
    pIVar4 = GImGui;
    GImGui->HoveredId = id;
    pIVar4->HoveredIdAllowOverlap = false;
    fVar6 = 0.0;
    if ((id != 0) && (pIVar4->HoveredIdPreviousFrame == id)) {
      fVar6 = pIVar4->HoveredIdTimer + (pIVar4->IO).DeltaTime;
    }
    pIVar4->HoveredIdTimer = fVar6;
  }
  if (bVar5) {
    bVar5 = DataTypeApplyOpFromText
                      (local_88,(pIVar3->InputTextState).InitialText.Data,data_type,data_ptr,
                       (char *)0x0);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::InputScalarAsWidgetReplacement(const ImRect& bb, ImGuiID id, const char* label, ImGuiDataType data_type, void* data_ptr, const char* format)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Our replacement widget will override the focus ID (registered previously to allow for a TAB focus to happen)
    // On the first frame, g.ScalarAsInputTextId == 0, then on subsequent frames it becomes == id
    SetActiveID(g.ScalarAsInputTextId, window);
    g.ActiveIdAllowNavDirFlags = (1 << ImGuiDir_Up) | (1 << ImGuiDir_Down);
    SetHoveredID(0);
    FocusableItemUnregister(window);

    char fmt_buf[32];
    char data_buf[32];
    format = ParseFormatTrimDecorations(format, fmt_buf, IM_ARRAYSIZE(fmt_buf));
    DataTypeFormatString(data_buf, IM_ARRAYSIZE(data_buf), data_type, data_ptr, format);
    ImGuiInputTextFlags flags = ImGuiInputTextFlags_AutoSelectAll | ((data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double) ? ImGuiInputTextFlags_CharsScientific : ImGuiInputTextFlags_CharsDecimal);
    bool value_changed = InputTextEx(label, data_buf, IM_ARRAYSIZE(data_buf), bb.GetSize(), flags);
    if (g.ScalarAsInputTextId == 0)     // First frame we started displaying the InputText widget
    {
        IM_ASSERT(g.ActiveId == id);    // InputText ID expected to match the Slider ID
        g.ScalarAsInputTextId = g.ActiveId;
        SetHoveredID(id);
    }
    if (value_changed)
        return DataTypeApplyOpFromText(data_buf, g.InputTextState.InitialText.begin(), data_type, data_ptr, NULL);
    return false;
}